

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeFreeCursor(Vdbe *p,VdbeCursor *pCx)

{
  long *plVar1;
  long lVar2;
  BtCursor *in_RSI;
  sqlite3_module *pModule;
  sqlite3_vtab_cursor *pVtabCursor;
  VdbeCursor *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  if (in_RSI != (BtCursor *)0x0) {
    sqlite3VdbeSorterClose(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (in_RSI->pBt == (BtShared *)0x0) {
      if (in_RSI->pBtree == (Btree *)0x0) {
        if ((in_RSI->info).nKey != 0) {
          plVar1 = (long *)(in_RSI->info).nKey;
          lVar2 = *(long *)*plVar1;
          *(int *)(*plVar1 + 8) = *(int *)(*plVar1 + 8) + -1;
          (**(code **)(lVar2 + 0x38))(plVar1);
        }
      }
      else {
        sqlite3BtreeCloseCursor(in_RSI);
      }
    }
    else {
      sqlite3BtreeClose((Btree *)in_RSI);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursor(Vdbe *p, VdbeCursor *pCx){
  if( pCx==0 ){
    return;
  }
  sqlite3VdbeSorterClose(p->db, pCx);
  if( pCx->pBt ){
    sqlite3BtreeClose(pCx->pBt);
    /* The pCx->pCursor will be close automatically, if it exists, by
    ** the call above. */
  }else if( pCx->pCursor ){
    sqlite3BtreeCloseCursor(pCx->pCursor);
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  else if( pCx->pVtabCursor ){
    sqlite3_vtab_cursor *pVtabCursor = pCx->pVtabCursor;
    const sqlite3_module *pModule = pVtabCursor->pVtab->pModule;
    assert( pVtabCursor->pVtab->nRef>0 );
    pVtabCursor->pVtab->nRef--;
    pModule->xClose(pVtabCursor);
  }
#endif
}